

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O2

int32_t __thiscall
icu_63::ChineseCalendar::handleComputeMonthStart
          (ChineseCalendar *this,int32_t eyear,int32_t month,UBool useMonth)

{
  int32_t iVar1;
  int32_t iVar2;
  int iVar3;
  uint uVar4;
  int32_t iVar5;
  double dVar6;
  UErrorCode status;
  double m;
  
  if (0xb < (uint)month) {
    m = (double)month;
    dVar6 = ClockMath::floorDivide(m,12.0,&m);
    eyear = (int)dVar6 + eyear;
    month = (int32_t)m;
  }
  iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x39])
                    (this,(ulong)((eyear + *(int *)&(this->super_Calendar).field_0x264) - 1));
  uVar4 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                    ((double)(month * 0x1d + iVar3),this,1);
  iVar3 = uVar4 + 0x253d8c;
  iVar1 = (this->super_Calendar).fFields[2];
  iVar2 = (this->super_Calendar).fFields[0x16];
  status = U_ZERO_ERROR;
  Calendar::computeGregorianFields(&this->super_Calendar,iVar3,&status);
  iVar5 = 0;
  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar5 = iVar2;
    if (useMonth == '\0') {
      iVar5 = 0;
    }
    (*(this->super_Calendar).super_UObject._vptr_UObject[0x38])
              (this,(ulong)uVar4,(ulong)(uint)(this->super_Calendar).fGregorianYear,
               (ulong)(uint)(this->super_Calendar).fGregorianMonth,0);
    if ((month != (this->super_Calendar).fFields[2]) ||
       (iVar5 != (this->super_Calendar).fFields[0x16])) {
      iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                        ((double)(int)(uVar4 + 0x19),this,1);
      iVar3 = iVar3 + 0x253d8c;
    }
    (this->super_Calendar).fFields[2] = iVar1;
    (this->super_Calendar).fStamp[2] = 1;
    (this->super_Calendar).fIsSet[2] = '\x01';
    (this->super_Calendar).fFields[0x16] = iVar2;
    (this->super_Calendar).fStamp[0x16] = 1;
    (this->super_Calendar).fIsSet[0x16] = '\x01';
    iVar5 = iVar3 + -1;
  }
  return iVar5;
}

Assistant:

int32_t ChineseCalendar::handleComputeMonthStart(int32_t eyear, int32_t month, UBool useMonth) const {

    ChineseCalendar *nonConstThis = (ChineseCalendar*)this; // cast away const

    // If the month is out of range, adjust it into range, and
    // modify the extended year value accordingly.
    if (month < 0 || month > 11) {
        double m = month;
        eyear += (int32_t)ClockMath::floorDivide(m, 12.0, m);
        month = (int32_t)m;
    }

    int32_t gyear = eyear + fEpochYear - 1; // Gregorian year
    int32_t theNewYear = newYear(gyear);
    int32_t newMoon = newMoonNear(theNewYear + month * 29, TRUE);
    
    int32_t julianDay = newMoon + kEpochStartAsJulianDay;

    // Save fields for later restoration
    int32_t saveMonth = internalGet(UCAL_MONTH);
    int32_t saveIsLeapMonth = internalGet(UCAL_IS_LEAP_MONTH);

    // Ignore IS_LEAP_MONTH field if useMonth is false
    int32_t isLeapMonth = useMonth ? saveIsLeapMonth : 0;

    UErrorCode status = U_ZERO_ERROR;
    nonConstThis->computeGregorianFields(julianDay, status);
    if (U_FAILURE(status))
        return 0;
    
    // This will modify the MONTH and IS_LEAP_MONTH fields (only)
    nonConstThis->computeChineseFields(newMoon, getGregorianYear(),
                         getGregorianMonth(), FALSE);        

    if (month != internalGet(UCAL_MONTH) ||
        isLeapMonth != internalGet(UCAL_IS_LEAP_MONTH)) {
        newMoon = newMoonNear(newMoon + SYNODIC_GAP, TRUE);
        julianDay = newMoon + kEpochStartAsJulianDay;
    }

    nonConstThis->internalSet(UCAL_MONTH, saveMonth);
    nonConstThis->internalSet(UCAL_IS_LEAP_MONTH, saveIsLeapMonth);

    return julianDay - 1;
}